

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper1(ScriptContext *scriptContext,void *origHelperAddr,Var arg1)

{
  code *pcVar1;
  anon_class_16_2_a2bd5e14 fn;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  Var arg1_local;
  void *origHelperAddr_local;
  ScriptContext *scriptContext_local;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x52,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn.arg1 = arg1;
  fn.origHelperAddr = origHelperAddr;
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper1(Js::ScriptContext*,void*,void*)::__0>
                     (scriptContext,fn);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper1(ScriptContext* scriptContext, void* origHelperAddr, Var arg1)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod1)origHelperAddr)(arg1);
        });
    }